

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

bool __thiscall World::PKExcept(World *this,int mapid)

{
  int iVar1;
  mapped_type *pmVar2;
  Map *pMVar3;
  _Self local_d8;
  _List_node_base *local_d0;
  _List_iterator<int> local_c8;
  _Self local_c0;
  allocator<char> local_b1;
  key_type local_b0;
  string local_90;
  undefined1 local_70 [8];
  list<int,_std::allocator<int>_> except_list;
  allocator<char> local_41;
  key_type local_40;
  int local_1c;
  World *pWStack_18;
  int mapid_local;
  World *this_local;
  
  local_1c = mapid;
  pWStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"JailMap",&local_41);
  pmVar2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
           ::operator[](&(this->config).
                         super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                        ,&local_40);
  iVar1 = util::variant::operator_cast_to_int(pmVar2);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  if (mapid == iVar1) {
    this_local._7_1_ = 1;
  }
  else {
    pMVar3 = GetMap(this,(short)local_1c);
    if (pMVar3->arena == (Arena *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"PKExcept",&local_b1);
      pmVar2 = std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
               ::operator[](&(this->config).
                             super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                            ,&local_b0);
      util::variant::operator_cast_to_string(&local_90,pmVar2);
      PKExceptUnserialize((list<int,_std::allocator<int>_> *)local_70,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator(&local_b1);
      local_c8._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::begin
                     ((list<int,_std::allocator<int>_> *)local_70);
      local_d0 = (_List_node_base *)
                 std::__cxx11::list<int,_std::allocator<int>_>::end
                           ((list<int,_std::allocator<int>_> *)local_70);
      local_c0._M_node =
           (_List_node_base *)
           std::find<std::_List_iterator<int>,int>(local_c8,(_List_iterator<int>)local_d0,&local_1c)
      ;
      local_d8._M_node =
           (_List_node_base *)
           std::__cxx11::list<int,_std::allocator<int>_>::end
                     ((list<int,_std::allocator<int>_> *)local_70);
      this_local._7_1_ = std::operator!=(&local_c0,&local_d8);
      std::__cxx11::list<int,_std::allocator<int>_>::~list
                ((list<int,_std::allocator<int>_> *)local_70);
    }
    else {
      this_local._7_1_ = 1;
    }
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool World::PKExcept(int mapid)
{
	if (mapid == static_cast<int>(this->config["JailMap"]))
	{
		return true;
	}

	if (this->GetMap(mapid)->arena)
	{
		return true;
	}

	std::list<int> except_list = PKExceptUnserialize(this->config["PKExcept"]);

	return std::find(except_list.begin(), except_list.end(), mapid) != except_list.end();
}